

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking64.h
# Opt level: O0

void packforblock24_64(uint64_t base,uint64_t **pin,uint8_t **pw)

{
  ulong *puVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  uint64_t uVar26;
  uint64_t uVar27;
  uint64_t uVar28;
  uint64_t uVar29;
  uint64_t uVar30;
  uint64_t uVar31;
  uint64_t uVar32;
  uint64_t uVar33;
  uint64_t uVar34;
  uint64_t uVar35;
  uint64_t uVar36;
  uint64_t uVar37;
  uint64_t uVar38;
  uint64_t uVar39;
  uint64_t w11;
  uint64_t w10;
  uint64_t w9;
  uint64_t w8;
  uint64_t w7;
  uint64_t w6;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint64_t *in;
  uint64_t *pw64;
  uint8_t **pw_local;
  uint64_t **pin_local;
  
  puVar1 = (ulong *)*pw;
  puVar2 = *pin;
  uVar3 = puVar2[2];
  uVar4 = puVar2[3];
  uVar5 = puVar2[4];
  uVar6 = puVar2[5];
  uVar7 = puVar2[5];
  uVar8 = puVar2[6];
  uVar9 = puVar2[7];
  uVar10 = puVar2[8];
  uVar11 = puVar2[9];
  uVar12 = puVar2[10];
  uVar13 = puVar2[10];
  uVar14 = puVar2[0xb];
  uVar15 = puVar2[0xc];
  uVar16 = puVar2[0xd];
  uVar17 = puVar2[0xd];
  uVar18 = puVar2[0xe];
  uVar19 = puVar2[0xf];
  uVar20 = puVar2[0x10];
  uVar21 = puVar2[0x11];
  uVar22 = puVar2[0x12];
  uVar23 = puVar2[0x12];
  uVar24 = puVar2[0x13];
  uVar25 = puVar2[0x14];
  uVar26 = puVar2[0x15];
  uVar27 = puVar2[0x15];
  uVar28 = puVar2[0x16];
  uVar29 = puVar2[0x17];
  uVar30 = puVar2[0x18];
  uVar31 = puVar2[0x19];
  uVar32 = puVar2[0x1a];
  uVar33 = puVar2[0x1a];
  uVar34 = puVar2[0x1b];
  uVar35 = puVar2[0x1c];
  uVar36 = puVar2[0x1d];
  uVar37 = puVar2[0x1d];
  uVar38 = puVar2[0x1e];
  uVar39 = puVar2[0x1f];
  *puVar1 = puVar2[2] - base << 0x30 | (puVar2[1] - base) * 0x1000000 | *puVar2 - base;
  puVar1[1] = uVar6 - base << 0x38 |
              uVar5 - base << 0x20 | (uVar4 - base) * 0x100 | uVar3 - base >> 0x10;
  puVar1[2] = uVar9 - base << 0x28 | (uVar8 - base) * 0x10000 | uVar7 - base >> 8;
  puVar1[3] = uVar12 - base << 0x30 | (uVar11 - base) * 0x1000000 | uVar10 - base;
  puVar1[4] = uVar16 - base << 0x38 |
              uVar15 - base << 0x20 | (uVar14 - base) * 0x100 | uVar13 - base >> 0x10;
  puVar1[5] = uVar19 - base << 0x28 | (uVar18 - base) * 0x10000 | uVar17 - base >> 8;
  puVar1[6] = uVar22 - base << 0x30 | (uVar21 - base) * 0x1000000 | uVar20 - base;
  puVar1[7] = uVar26 - base << 0x38 |
              uVar25 - base << 0x20 | (uVar24 - base) * 0x100 | uVar23 - base >> 0x10;
  puVar1[8] = uVar29 - base << 0x28 | (uVar28 - base) * 0x10000 | uVar27 - base >> 8;
  puVar1[9] = uVar32 - base << 0x30 | (uVar31 - base) * 0x1000000 | uVar30 - base;
  puVar1[10] = uVar36 - base << 0x38 |
               uVar35 - base << 0x20 | (uVar34 - base) * 0x100 | uVar33 - base >> 0x10;
  puVar1[0xb] = uVar39 - base << 0x28 | (uVar38 - base) * 0x10000 | uVar37 - base >> 8;
  *pin = *pin + 0x20;
  *pw = *pw + 0x60;
  return;
}

Assistant:

static void packforblock24_64(const uint64_t base, const uint64_t ** pin, uint8_t ** pw) {
  uint64_t * pw64 = *(uint64_t **) pw;
  const uint64_t * in = *pin;
  /* we are going to touch  12 64-bit words */ 
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  uint64_t w6;
  uint64_t w7;
  uint64_t w8;
  uint64_t w9;
  uint64_t w10;
  uint64_t w11;
  w0 = (in[0] - base);
  w0 |=  (in[1] - base) << 24;
  w0 |= (in[2] - base) << 48;
  w1 = (in[2] - base) >> 16;
  w1 |=  (in[3] - base) << 8;
  w1 |=  (in[4] - base) << 32;
  w1 |= (in[5] - base) << 56;
  w2 = (in[5] - base) >> 8;
  w2 |=  (in[6] - base) << 16;
  w2 |=  (in[7] - base) << 40;
  w3 = (in[8] - base);
  w3 |=  (in[9] - base) << 24;
  w3 |= (in[10] - base) << 48;
  w4 = (in[10] - base) >> 16;
  w4 |=  (in[11] - base) << 8;
  w4 |=  (in[12] - base) << 32;
  w4 |= (in[13] - base) << 56;
  w5 = (in[13] - base) >> 8;
  w5 |=  (in[14] - base) << 16;
  w5 |=  (in[15] - base) << 40;
  w6 = (in[16] - base);
  w6 |=  (in[17] - base) << 24;
  w6 |= (in[18] - base) << 48;
  w7 = (in[18] - base) >> 16;
  w7 |=  (in[19] - base) << 8;
  w7 |=  (in[20] - base) << 32;
  w7 |= (in[21] - base) << 56;
  w8 = (in[21] - base) >> 8;
  w8 |=  (in[22] - base) << 16;
  w8 |=  (in[23] - base) << 40;
  w9 = (in[24] - base);
  w9 |=  (in[25] - base) << 24;
  w9 |= (in[26] - base) << 48;
  w10 = (in[26] - base) >> 16;
  w10 |=  (in[27] - base) << 8;
  w10 |=  (in[28] - base) << 32;
  w10 |= (in[29] - base) << 56;
  w11 = (in[29] - base) >> 8;
  w11 |=  (in[30] - base) << 16;
  w11 |=  (in[31] - base) << 40;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  pw64[6] = w6;
  pw64[7] = w7;
  pw64[8] = w8;
  pw64[9] = w9;
  pw64[10] = w10;
  pw64[11] = w11;
  *pin += 32; /* we consumed 32 64-bit integers */ 
  *pw += 96; /* we used up 96 output bytes */ 
}